

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O3

void __thiscall xray_re::xr_bone_motion::load_1(xr_bone_motion *this,xr_reader *r)

{
  uint8_t *puVar1;
  xr_envelope *pxVar2;
  uint_fast32_t i;
  long lVar3;
  
  xr_reader::r_sz(r,&this->m_name);
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 4;
  this->m_flags = *puVar1;
  lVar3 = 10;
  do {
    pxVar2 = (xr_envelope *)operator_new(0x28);
    pxVar2->_vptr_xr_envelope = (_func_int **)&PTR__xr_envelope_00249818;
    (pxVar2->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pxVar2->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pxVar2->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pxVar2->m_behaviour0 = '\x01';
    pxVar2->m_behaviour1 = '\x01';
    this->m_envelopes[lVar3 + -5] = pxVar2;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 4);
  lVar3 = 0;
  do {
    xr_envelope::load_1(this->m_envelopes[lVar3],r);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

void xr_bone_motion::load_1(xr_reader& r)
{
	r.r_sz(m_name);
	m_flags = uint8_t(r.r_u32() & UINT8_MAX);
	create_envelopes();
	for (uint_fast32_t i = 0; i != 6; ++i)
		m_envelopes[i]->load_1(r);
}